

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_bitset_container_andnot
               (array_container_t *src_1,bitset_container_t *src_2,array_container_t *dst)

{
  _Bool _Var1;
  int *in_RDX;
  array_container_t *in_RSI;
  int *in_RDI;
  uint16_t key;
  int i;
  int32_t origcard;
  int32_t newcard;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (in_RDX[1] < *in_RDI) {
    array_container_grow(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  }
  iVar4 = 0;
  iVar3 = *in_RDI;
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    *(undefined2 *)(*(long *)(in_RDX + 2) + (long)iVar4 * 2) =
         *(undefined2 *)(*(long *)(in_RDI + 2) + (long)iVar2 * 2);
    _Var1 = bitset_container_contains
                      ((bitset_container_t *)CONCAT44(iVar4,iVar3),(uint16_t)((uint)iVar2 >> 0x10));
    iVar4 = (uint)!_Var1 + iVar4;
  }
  *in_RDX = iVar4;
  return;
}

Assistant:

void array_bitset_container_andnot(const array_container_t *src_1,
                                   const bitset_container_t *src_2,
                                   array_container_t *dst) {
    // follows Java implementation as of June 2016
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    int32_t newcard = 0;
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        dst->array[newcard] = key;
        newcard += 1 - bitset_container_contains(src_2, key);
    }
    dst->cardinality = newcard;
}